

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_uv_area(REF_GEOM ref_geom,REF_INT *nodes,REF_DBL *uv_area)

{
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  double d;
  double c;
  double b;
  double a;
  double dStack_58;
  REF_INT sens;
  REF_DBL uv2 [2];
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  REF_DBL *uv_area_local;
  REF_INT *nodes_local;
  REF_GEOM ref_geom_local;
  
  ref_geom_local._4_4_ =
       ref_geom_cell_tuv(ref_geom,*nodes,nodes,2,uv1 + 1,(REF_INT *)((long)&a + 4));
  if (ref_geom_local._4_4_ == 0) {
    ref_geom_local._4_4_ =
         ref_geom_cell_tuv(ref_geom,nodes[1],nodes,2,uv2 + 1,(REF_INT *)((long)&a + 4));
    if (ref_geom_local._4_4_ == 0) {
      ref_geom_local._4_4_ =
           ref_geom_cell_tuv(ref_geom,nodes[2],nodes,2,&stack0xffffffffffffffa8,
                             (REF_INT *)((long)&a + 4));
      if (ref_geom_local._4_4_ == 0) {
        *uv_area = ((uv1[1] - dStack_58) * (uv1[0] - uv2[0]) +
                   -((uv0[0] - uv2[0]) * (uv2[1] - dStack_58))) * 0.5;
        ref_geom_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x105,"ref_geom_uv_area",(ulong)ref_geom_local._4_4_,"uv2");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x103,
             "ref_geom_uv_area",(ulong)ref_geom_local._4_4_,"uv1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x101,
           "ref_geom_uv_area",(ulong)ref_geom_local._4_4_,"uv0");
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_uv_area(REF_GEOM ref_geom, REF_INT *nodes,
                                    REF_DBL *uv_area) {
  REF_DBL uv0[2], uv1[2], uv2[2];
  REF_INT sens;
  double a, b, c, d;
  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_FACE, uv0, &sens),
      "uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_FACE, uv1, &sens),
      "uv1");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[2], nodes, REF_GEOM_FACE, uv2, &sens),
      "uv2");
  a = uv0[0] - uv2[0];
  b = uv0[1] - uv2[1];
  c = uv1[0] - uv2[0];
  d = uv1[1] - uv2[1];
  *uv_area = 0.5 * (a * d - b * c);
  return REF_SUCCESS;
}